

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::CallExpressionNode::BuildProgram
          (CallExpressionNode *this,Scope *scope,ostream *out)

{
  const_reference pvVar1;
  pointer pAVar2;
  string *psVar3;
  ASTTokenBasic *local_58;
  ASTTokenBasic *local_40;
  ostream *out_local;
  Scope *scope_local;
  CallExpressionNode *this_local;
  
  pvVar1 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar2 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::get(pvVar1);
  if (pAVar2 == (pointer)0x0) {
    local_40 = (ASTTokenBasic *)0x0;
  }
  else {
    local_40 = (ASTTokenBasic *)
               __dynamic_cast(pAVar2,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
  }
  psVar3 = ASTTokenBasic::GetStr_abi_cxx11_(local_40);
  vpl::Scope::PrepareFunction(scope,psVar3);
  pvVar1 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,1);
  pAVar2 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar1);
  (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
  pvVar1 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar2 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::get(pvVar1);
  if (pAVar2 == (pointer)0x0) {
    local_58 = (ASTTokenBasic *)0x0;
  }
  else {
    local_58 = (ASTTokenBasic *)
               __dynamic_cast(pAVar2,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
  }
  psVar3 = ASTTokenBasic::GetStr_abi_cxx11_(local_58);
  vpl::Scope::CallFunction(scope,psVar3);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                scope->PrepareFunction(GET_TOKEN_STRING(children_[0]));
                children_[1]->BuildProgram(scope, out);
                scope->CallFunction(GET_TOKEN_STRING(children_[0]));
            }